

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

Token __thiscall slang::parsing::Preprocessor::MacroParser::expect(MacroParser *this,TokenKind kind)

{
  uint uVar1;
  size_type sVar2;
  reference peVar3;
  TokenKind in_SI;
  long in_RDI;
  Token TVar4;
  Token last;
  undefined6 in_stack_00000088;
  undefined1 in_stack_00000098 [16];
  undefined1 in_stack_000000c0 [16];
  undefined1 in_stack_000000d0 [16];
  MacroParser *in_stack_ffffffffffffff60;
  long lVar5;
  Preprocessor *in_stack_fffffffffffffff0;
  
  uVar1 = *(uint *)(in_RDI + 0x18);
  lVar5 = in_RDI;
  sVar2 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::size
                    ((span<const_slang::parsing::Token,_18446744073709551615UL> *)0x2904e8);
  if (uVar1 < sVar2) {
    peVar3 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                       ((span<const_slang::parsing::Token,_18446744073709551615UL> *)(in_RDI + 8),
                        (ulong)*(uint *)(in_RDI + 0x18));
    if (peVar3->kind == in_SI) {
      TVar4 = next(in_stack_ffffffffffffff60);
    }
    else {
      if (*(int *)(in_RDI + 0x18) == 0) {
        Token::Token((Token *)in_stack_ffffffffffffff60);
      }
      else {
        std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                  ((span<const_slang::parsing::Token,_18446744073709551615UL> *)(in_RDI + 8),
                   (ulong)(*(int *)(in_RDI + 0x18) - 1));
      }
      std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                ((span<const_slang::parsing::Token,_18446744073709551615UL> *)(in_RDI + 8),
                 (ulong)*(uint *)(in_RDI + 0x18));
      Token::Token((Token *)in_stack_ffffffffffffff60);
      TVar4 = Token::createExpected
                        ((BumpAllocator *)this,(Diagnostics *)CONCAT26(kind,in_stack_00000088),
                         (Token)in_stack_00000098,last.info._6_2_,(Token)in_stack_000000c0,
                         (Token)in_stack_000000d0);
    }
  }
  else {
    TVar4 = Preprocessor::expect(in_stack_fffffffffffffff0,(TokenKind)((ulong)lVar5 >> 0x30));
  }
  return TVar4;
}

Assistant:

Token Preprocessor::MacroParser::expect(TokenKind kind) {
    if (currentIndex >= buffer.size())
        return pp.expect(kind);

    if (buffer[currentIndex].kind != kind) {
        Token last = currentIndex > 0 ? buffer[currentIndex - 1] : Token();
        return Token::createExpected(pp.alloc, pp.diagnostics, buffer[currentIndex], kind, last,
                                     Token());
    }
    return next();
}